

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O0

int lws_mqtt_fill_fixed_header
              (uint8_t *p,lws_mqtt_control_packet_t ctrl_pkt_type,uint8_t dup,
              lws_mqtt_qos_levels_t qos,uint8_t retain)

{
  byte local_26;
  lws_mqtt_fixed_hdr_t hdr;
  uint8_t retain_local;
  lws_mqtt_qos_levels_t qos_local;
  uint8_t dup_local;
  lws_mqtt_control_packet_t ctrl_pkt_type_local;
  uint8_t *p_local;
  
  qos_local._0_1_ = (undefined1)ctrl_pkt_type;
  local_26 = (undefined1)qos_local << 4;
  if (1 < ctrl_pkt_type - LMQCP_CTOS_CONNECT) {
    if (ctrl_pkt_type == LMQCP_PUBLISH) {
      if (QOS2 < qos) {
        _lws_log(1,"%s: Unsupport QoS level 0x%x\n","lws_mqtt_fill_fixed_header",(ulong)qos);
        return -1;
      }
      local_26 = local_26 | (dup != '\0') << 3 | ((byte)qos & 3) << 1 | retain != '\0';
    }
    else if (1 < ctrl_pkt_type - LMQCP_PUBACK) {
      if (ctrl_pkt_type != LMQCP_PUBREL) {
        if (ctrl_pkt_type == LMQCP_PUBCOMP) goto LAB_001264fd;
        if (ctrl_pkt_type != LMQCP_CTOS_SUBSCRIBE) {
          if (ctrl_pkt_type == LMQCP_STOC_SUBACK) goto LAB_001264fd;
          if (ctrl_pkt_type != LMQCP_CTOS_UNSUBSCRIBE) {
            if (4 < ctrl_pkt_type - LMQCP_STOC_UNSUBACK) {
              return -1;
            }
            goto LAB_001264fd;
          }
        }
      }
      local_26 = local_26 | 2;
    }
  }
LAB_001264fd:
  *p = local_26;
  return 0;
}

Assistant:

int
lws_mqtt_fill_fixed_header(uint8_t *p, lws_mqtt_control_packet_t ctrl_pkt_type,
			   uint8_t dup, lws_mqtt_qos_levels_t qos,
			   uint8_t retain)
{
	lws_mqtt_fixed_hdr_t hdr;

	hdr.bits = 0;
	hdr.flags.ctrl_pkt_type = (uint8_t) ctrl_pkt_type;

	switch(ctrl_pkt_type) {
	case LMQCP_PUBLISH:
		hdr.flags.dup = !!dup;
		/*
		 * A PUBLISH Packet MUST NOT have both QoS bits set to
		 * 1. If a Server or Client receives a PUBLISH Packet
		 * which has both QoS bits set to 1 it MUST close the
		 * Network Connection [MQTT-3.3.1-4].
		 */
		if (qos >= RESERVED_QOS_LEVEL) {
			lwsl_err("%s: Unsupport QoS level 0x%x\n",
				 __func__, qos);
			return -1;
		}
		hdr.flags.qos = (uint8_t)qos;
		hdr.flags.retain = !!retain;
		break;

	case LMQCP_CTOS_CONNECT:
	case LMQCP_STOC_CONNACK:
	case LMQCP_PUBACK:
	case LMQCP_PUBREC:
	case LMQCP_PUBCOMP:
	case LMQCP_STOC_SUBACK:
	case LMQCP_STOC_UNSUBACK:
	case LMQCP_CTOS_PINGREQ:
	case LMQCP_STOC_PINGRESP:
	case LMQCP_DISCONNECT:
	case LMQCP_AUTH:
		hdr.bits &= 0xf0;
		break;

	/*
	 * Bits 3,2,1 and 0 of the fixed header of the PUBREL,
	 * SUBSCRIBE, UNSUBSCRIBE Control Packets are reserved and
	 * MUST be set to 0,0,1 and 0 respectively. The Server MUST
	 * treat any other value as malformed and close the Network
	 * Connection [MQTT-3.6.1-1], [MQTT-3.8.1-1], [MQTT-3.10.1-1].
	 */
	case LMQCP_PUBREL:
	case LMQCP_CTOS_SUBSCRIBE:
	case LMQCP_CTOS_UNSUBSCRIBE:
		hdr.bits |= 0x02;
		break;

	default:
		return -1;
	}

	*p = hdr.bits;

	return 0;
}